

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  code *pcVar1;
  bool bVar2;
  NestedArray *pNVar3;
  NestedArray *pNVar4;
  undefined4 *puVar5;
  uint local_2c;
  uint i;
  NestedArray *otherNestedArray;
  NestedArray *thisNestedArray;
  ParseableFunctionInfo *other_local;
  ParseableFunctionInfo *this_local;
  
  pNVar3 = GetNestedArray(this);
  pNVar4 = GetNestedArray(other);
  if (pNVar3 == (NestedArray *)0x0) {
    if (pNVar4 != (NestedArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x629,"(otherNestedArray == nullptr)",
                                  "otherNestedArray == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    if (pNVar4->nestedCount != pNVar3->nestedCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x62c,
                                  "(otherNestedArray->nestedCount == thisNestedArray->nestedCount)",
                                  "otherNestedArray->nestedCount == thisNestedArray->nestedCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    for (local_2c = 0; local_2c < pNVar3->nestedCount; local_2c = local_2c + 1) {
      Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=
                ((WriteBarrierPtr<Js::FunctionInfo> *)(pNVar4 + (ulong)local_2c + 1),
                 (WriteBarrierPtr<Js::FunctionInfo> *)(pNVar3 + (ulong)local_2c + 1));
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo * other)
    {
        NestedArray * thisNestedArray = this->GetNestedArray();
        NestedArray * otherNestedArray = other->GetNestedArray();
        if (thisNestedArray == nullptr)
        {
            Assert(otherNestedArray == nullptr);
            return;
        }
        Assert(otherNestedArray->nestedCount == thisNestedArray->nestedCount);

        for (uint i = 0; i < thisNestedArray->nestedCount; i++)
        {
            otherNestedArray->functionInfoArray[i] = thisNestedArray->functionInfoArray[i];
        }
    }